

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall
QMenuPrivate::scrollMenu(QMenuPrivate *this,QAction *action,ScrollLocation location,bool active)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  QWidget *pQVar7;
  QStyle *pQVar8;
  qsizetype qVar9;
  const_reference ppQVar10;
  long lVar11;
  QRect *pQVar12;
  int *piVar13;
  byte in_CL;
  int in_EDX;
  QAction *in_RSI;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *w;
  QRect *current;
  int i_3;
  int delta;
  int newTop;
  int newHeight;
  int desktopFrame;
  int i_2;
  int saccum;
  uint newScrollFlags;
  int saccum_2;
  int i_1;
  int saccum_1;
  int i;
  int fw;
  int vmargin;
  int botScroll;
  int topScroll;
  QMenu *q;
  QRect geom;
  QRect screen;
  int newOffset;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  QMenuPrivate *in_stack_fffffffffffffef0;
  QScreen *in_stack_fffffffffffffef8;
  QMenuPrivate *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff34;
  undefined1 activateFirst;
  QMenuPrivate *in_stack_ffffffffffffff40;
  int local_b0;
  int local_ac;
  int local_90;
  int local_88;
  int local_7c;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_30;
  undefined1 *local_2c;
  undefined1 *local_24;
  undefined1 local_1c [16];
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = &q_func(in_RDI)->super_QWidget;
  if ((in_RDI->scroll != (QMenuScroller *)0x0) && (in_RDI->scroll->scrollFlags != '\0')) {
    updateActionRects((QMenuPrivate *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
    ;
    local_c = 0;
    if ((in_RDI->scroll->scrollFlags & 1) == 0) {
      local_ac = 0;
    }
    else {
      local_ac = scrollerHeight(in_stack_fffffffffffffef0);
    }
    if ((in_RDI->scroll->scrollFlags & 2) == 0) {
      local_b0 = 0;
    }
    else {
      local_b0 = scrollerHeight(in_stack_fffffffffffffef0);
    }
    pQVar8 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                           );
    iVar2 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x1d,0,pQVar7);
    pQVar8 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                           );
    iVar3 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x1e,0,pQVar7);
    if (in_EDX == 2) {
      local_68 = 0;
      for (local_64 = 0; qVar9 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions),
          local_64 < qVar9; local_64 = local_64 + 1) {
        ppQVar10 = QList<QAction_*>::at
                             ((QList<QAction_*> *)in_stack_fffffffffffffef0,
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if (*ppQVar10 == in_RSI) {
          local_c = local_ac - local_68;
          break;
        }
        QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffef0,
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        iVar4 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                             );
        local_68 = iVar4 + local_68;
      }
    }
    else {
      local_6c = 0;
      local_70 = 0;
      while( true ) {
        in_stack_ffffffffffffff40 = (QMenuPrivate *)(long)local_6c;
        qVar9 = QList<QAction_*>::size(&(in_RDI->super_QWidgetPrivate).actions);
        if (qVar9 <= (long)in_stack_ffffffffffffff40) break;
        QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffef0,
                         CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        iVar4 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                             );
        local_70 = iVar4 + local_70;
        ppQVar10 = QList<QAction_*>::at
                             ((QList<QAction_*> *)in_stack_fffffffffffffef0,
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        if (*ppQVar10 == in_RSI) {
          if (in_EDX == 3) {
            iVar4 = QWidget::height((QWidget *)0x643ae5);
            local_c = (iVar4 / 2 - local_b0) - (local_70 - local_ac);
          }
          else {
            iVar4 = QWidget::height((QWidget *)0x643b1a);
            local_c = (iVar4 - local_b0) - local_70;
          }
          break;
        }
        local_6c = local_6c + 1;
      }
      if (local_c != 0) {
        local_c = local_c + iVar3 * -2;
      }
    }
    uVar6 = (uint)(local_c < 0);
    local_7c = 0;
    iVar4 = local_c;
    while( true ) {
      lVar11 = (long)local_7c;
      qVar9 = QList<QRect>::size(&in_RDI->actionRects);
      if (qVar9 <= lVar11) break;
      QList<QRect>::at((QList<QRect> *)in_stack_fffffffffffffef0,
                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      in_stack_ffffffffffffff34 =
           QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 + iVar4;
      iVar4 = in_stack_ffffffffffffff34;
      iVar5 = QWidget::height((QWidget *)0x643c1f);
      if (iVar5 < in_stack_ffffffffffffff34) {
        uVar6 = uVar6 | 2;
        break;
      }
      local_7c = local_7c + 1;
    }
    if (((uVar6 & 2) == 0) && ((in_RDI->scroll->scrollFlags & 2) != 0)) {
      iVar5 = QWidget::height((QWidget *)0x643c90);
      local_c = ((((iVar5 - (iVar4 - local_c)) + iVar3 * -2) - iVar2) -
                (int)(in_RDI->super_QWidgetPrivate).topmargin) -
                (int)(in_RDI->super_QWidgetPrivate).bottommargin;
      if ((*(ushort *)&in_RDI->field_0x420 >> 9 & 1) != 0) {
        pQVar8 = QWidget::style((QWidget *)
                                CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        iVar3 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x1f,0,pQVar7);
        local_c = local_c - iVar3;
      }
    }
    if (((uVar6 & 1) == 0) && ((in_RDI->scroll->scrollFlags & 1) != 0)) {
      local_c = 0;
    }
    if ((uVar6 & 1) != 0) {
      local_c = local_c - iVar2;
    }
    local_1c._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_1c._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_1c = (undefined1  [16])popupGeometry(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    pQVar8 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                           );
    iVar2 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,0x20,0,pQVar7);
    iVar3 = QWidget::height((QWidget *)0x643df3);
    iVar5 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    if (iVar3 < iVar5 + iVar2 * -2 + -1) {
      local_2c = &DAT_aaaaaaaaaaaaaaaa;
      local_24 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar12 = QWidget::geometry(pQVar7);
      local_2c._0_4_ = pQVar12->x1;
      local_2c._4_4_ = pQVar12->y1;
      local_24._0_4_ = pQVar12->x2;
      local_24._4_4_ = pQVar12->y2;
      if ((in_RDI->scroll->scrollOffset < local_c) &&
         ((in_RDI->scroll->scrollFlags & uVar6 & 1) != 0)) {
        in_stack_ffffffffffffff2c =
             QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        in_stack_ffffffffffffff2c =
             in_stack_ffffffffffffff2c - (local_c - in_RDI->scroll->scrollOffset);
        iVar3 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                             );
        if (iVar3 < in_stack_ffffffffffffff2c) {
          QRect::setHeight((QRect *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
        }
      }
      else if ((in_RDI->scroll->scrollFlags & uVar6 & 2) != 0) {
        local_88 = QRect::top((QRect *)0x643f32);
        local_88 = local_88 + (local_c - in_RDI->scroll->scrollOffset);
        in_stack_ffffffffffffff24 = iVar2;
        in_stack_ffffffffffffff28 = local_88;
        iVar3 = QRect::top((QRect *)0x643f73);
        if (in_stack_ffffffffffffff28 < in_stack_ffffffffffffff24 + iVar3) {
          in_stack_ffffffffffffff20 = iVar2;
          local_88 = QRect::top((QRect *)0x643f9b);
          local_88 = in_stack_ffffffffffffff20 + local_88;
        }
        iVar3 = QRect::top((QRect *)0x643fc2);
        if (local_88 < iVar3) {
          QRect::setTop((QRect *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
          local_c = 0;
          uVar6 = uVar6 & 0xfffffffe;
        }
      }
      iVar3 = QRect::bottom((QRect *)0x64400d);
      iVar5 = QRect::bottom((QRect *)0x64401e);
      if (iVar5 - iVar2 < iVar3) {
        QRect::bottom((QRect *)0x64403c);
        QRect::setBottom((QRect *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      }
      iVar3 = QRect::top((QRect *)0x64405f);
      iVar5 = QRect::top((QRect *)0x64407b);
      if (iVar3 < iVar2 + iVar5) {
        QRect::top((QRect *)0x6440a3);
        QRect::setTop((QRect *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      }
      QWidget::geometry(pQVar7);
      bVar1 = ::operator!=((QRect *)in_stack_fffffffffffffef0,
                           (QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      if (bVar1) {
        QWidget::setGeometry
                  ((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                   (QRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      }
    }
    local_30 = 0;
    piVar13 = qMin<int>(&local_30,&local_c);
    activateFirst = (undefined1)((uint)in_stack_ffffffffffffff34 >> 0x18);
    iVar2 = *piVar13 - in_RDI->scroll->scrollOffset;
    if (((*(ushort *)&in_RDI->field_0x420 & 1) == 0) && (iVar2 != 0)) {
      local_90 = 0;
      while( true ) {
        iVar3 = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
        pQVar12 = (QRect *)(long)local_90;
        qVar9 = QList<QRect>::size(&in_RDI->actionRects);
        activateFirst = (undefined1)((uint)in_stack_ffffffffffffff34 >> 0x18);
        if (qVar9 <= (long)pQVar12) break;
        in_stack_fffffffffffffef0 =
             (QMenuPrivate *)
             QList<QRect>::operator[]
                       ((QList<QRect> *)in_stack_fffffffffffffef0,
                        CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        QRect::top((QRect *)0x6441d4);
        QRect::moveTop(pQVar12,iVar3);
        in_stack_fffffffffffffef8 = (QScreen *)&in_RDI->widgetItems;
        QList<QAction_*>::at
                  ((QList<QAction_*> *)in_stack_fffffffffffffef0,
                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        pQVar7 = QHash<QAction_*,_QWidget_*>::value
                           ((QHash<QAction_*,_QWidget_*> *)in_stack_fffffffffffffef8,
                            (QAction **)in_stack_fffffffffffffef0);
        if (pQVar7 != (QWidget *)0x0) {
          QWidget::setGeometry
                    ((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                     (QRect *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        }
        local_90 = local_90 + 1;
      }
    }
    in_RDI->scroll->scrollOffset = iVar2 + in_RDI->scroll->scrollOffset;
    in_RDI->scroll->scrollFlags = (quint8)uVar6;
    if ((in_CL & 1) != 0) {
      setCurrentAction(in_stack_ffffffffffffff40,(QAction *)CONCAT44(uVar6,iVar4),
                       (int)((ulong)lVar11 >> 0x20),(SelectionReason)lVar11,(bool)activateFirst);
    }
    QWidget::update((QWidget *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::scrollMenu(QAction *action, QMenuScroller::ScrollLocation location, bool active)
{
    Q_Q(QMenu);
    if (!scroll || !scroll->scrollFlags)
        return;
    updateActionRects();
    int newOffset = 0;
    const int topScroll = (scroll->scrollFlags & QMenuScroller::ScrollUp)   ? scrollerHeight() : 0;
    const int botScroll = (scroll->scrollFlags & QMenuScroller::ScrollDown) ? scrollerHeight() : 0;
    const int vmargin = q->style()->pixelMetric(QStyle::PM_MenuVMargin, nullptr, q);
    const int fw = q->style()->pixelMetric(QStyle::PM_MenuPanelWidth, nullptr, q);

    if (location == QMenuScroller::ScrollTop) {
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            if (actions.at(i) == action) {
                newOffset = topScroll - saccum;
                break;
            }
            saccum += actionRects.at(i).height();
        }
    } else {
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            saccum += actionRects.at(i).height();
            if (actions.at(i) == action) {
                if (location == QMenuScroller::ScrollCenter)
                    newOffset = ((q->height() / 2) - botScroll) - (saccum - topScroll);
                else
                    newOffset = (q->height() - botScroll) - saccum;
                break;
            }
        }
        if (newOffset)
            newOffset -= fw * 2;
    }

    //figure out which scroll flags
    uint newScrollFlags = QMenuScroller::ScrollNone;
    if (newOffset < 0) //easy and cheap one
        newScrollFlags |= QMenuScroller::ScrollUp;
    int saccum = newOffset;
    for(int i = 0; i < actionRects.size(); i++) {
        saccum += actionRects.at(i).height();
        if (saccum > q->height()) {
            newScrollFlags |= QMenuScroller::ScrollDown;
            break;
        }
    }

    if (!(newScrollFlags & QMenuScroller::ScrollDown) && (scroll->scrollFlags & QMenuScroller::ScrollDown)) {
        newOffset = q->height() - (saccum - newOffset) - fw*2 - vmargin - topmargin - bottommargin;    //last item at bottom
        if (tearoff)
            newOffset -= q->style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, q);
    }

    if (!(newScrollFlags & QMenuScroller::ScrollUp) && (scroll->scrollFlags & QMenuScroller::ScrollUp)) {
        newOffset = 0;  //first item at top
    }

    if (newScrollFlags & QMenuScroller::ScrollUp)
        newOffset -= vmargin;

    QRect screen = popupGeometry();
    const int desktopFrame = q->style()->pixelMetric(QStyle::PM_MenuDesktopFrameWidth, nullptr, q);
    if (q->height() < screen.height()-(desktopFrame*2)-1) {
        QRect geom = q->geometry();
        if (newOffset > scroll->scrollOffset && (scroll->scrollFlags & newScrollFlags & QMenuScroller::ScrollUp)) { //scroll up
            const int newHeight = geom.height()-(newOffset-scroll->scrollOffset);
            if (newHeight > geom.height())
                geom.setHeight(newHeight);
        } else if (scroll->scrollFlags & newScrollFlags & QMenuScroller::ScrollDown) {
            int newTop = geom.top() + (newOffset-scroll->scrollOffset);
            if (newTop < desktopFrame+screen.top())
                newTop = desktopFrame+screen.top();
            if (newTop < geom.top()) {
                geom.setTop(newTop);
                newOffset = 0;
                newScrollFlags &= ~QMenuScroller::ScrollUp;
            }
        }
        if (geom.bottom() > screen.bottom() - desktopFrame)
            geom.setBottom(screen.bottom() - desktopFrame);
        if (geom.top() < desktopFrame+screen.top())
            geom.setTop(desktopFrame+screen.top());
        if (geom != q->geometry()) {
#if 0
            if (newScrollFlags & QMenuScroller::ScrollDown &&
               q->geometry().top() - geom.top() >= -newOffset)
                newScrollFlags &= ~QMenuScroller::ScrollDown;
#endif
            q->setGeometry(geom);
        }
    }

    //actually update flags
    const int delta = qMin(0, newOffset) - scroll->scrollOffset; //make sure the new offset is always negative
    if (!itemsDirty && delta) {
        //we've scrolled so we need to update the action rects
        for (int i = 0; i < actionRects.size(); ++i) {
            QRect &current = actionRects[i];
            current.moveTop(current.top() + delta);

            //we need to update the widgets geometry
            if (QWidget *w = widgetItems.value(actions.at(i)))
                w->setGeometry(current);
        }
    }
    scroll->scrollOffset += delta;
    scroll->scrollFlags = newScrollFlags;
    if (active)
        setCurrentAction(action);

    q->update();     //issue an update so we see all the new state..
}